

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O3

bool __thiscall cmCursesMainForm::LookForCacheEntry(cmCursesMainForm *this,string *key)

{
  vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_> *pvVar1;
  pointer ppcVar2;
  pointer __s1;
  size_t __n;
  int iVar3;
  pointer ppcVar4;
  
  pvVar1 = this->Entries;
  if (pvVar1 != (vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                 *)0x0) {
    ppcVar4 = (pvVar1->
              super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppcVar2 = (pvVar1->
              super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (ppcVar4 != ppcVar2) {
      __s1 = (key->_M_dataplus)._M_p;
      __n = key->_M_string_length;
      do {
        if (__n == ((*ppcVar4)->Key)._M_string_length) {
          if (__n == 0) {
            return true;
          }
          iVar3 = bcmp(__s1,((*ppcVar4)->Key)._M_dataplus._M_p,__n);
          if (iVar3 == 0) {
            return true;
          }
        }
        ppcVar4 = ppcVar4 + 1;
      } while (ppcVar4 != ppcVar2);
    }
  }
  return false;
}

Assistant:

bool cmCursesMainForm::LookForCacheEntry(const std::string& key)
{
  if (!this->Entries) {
    return false;
  }

  std::vector<cmCursesCacheEntryComposite*>::iterator it;
  for (it = this->Entries->begin(); it != this->Entries->end(); ++it) {
    if (key == (*it)->Key) {
      return true;
    }
  }

  return false;
}